

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<unsigned_char,ImPlot::TransformerLogLog>
               (TransformerLogLog transformer,ImDrawList *DrawList,uchar *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  double dVar1;
  byte bVar2;
  float fVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  uchar *puVar10;
  byte bVar11;
  ImU32 col;
  ImPlotPoint *pIVar12;
  long lVar13;
  byte bVar14;
  ImPlotContext *gp;
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar18;
  double dVar19;
  double dVar20;
  ImVec4 IVar21;
  GetterHeatmap<unsigned_char> getter;
  ImVec2 b;
  ImVec2 local_168;
  char *local_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined1 local_148 [16];
  double local_138;
  double local_130;
  uchar *local_128;
  double local_120;
  double local_118;
  long local_110;
  long local_108;
  double local_100;
  double local_f8;
  ImDrawList *local_f0;
  uchar *local_e8;
  double local_e0;
  GetterHeatmap<unsigned_char> local_d8;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLin> local_78;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  
  pIVar8 = GImPlot;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    bVar11 = *values;
    bVar14 = bVar11;
    if (1 < cols * rows) {
      uVar16 = 1;
      do {
        bVar2 = values[uVar16];
        if (bVar2 < bVar14) {
          bVar14 = bVar2;
        }
        if (bVar11 < bVar2) {
          bVar11 = bVar2;
        }
        uVar16 = uVar16 + 1;
      } while ((uint)(cols * rows) != uVar16);
    }
    scale_min = (double)bVar14;
    scale_max = (double)bVar11;
  }
  local_160 = fmt;
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    if (reverse_y) {
      dVar20 = -1.0;
      pIVar12 = bounds_max;
    }
    else {
      dVar20 = 1.0;
      pIVar12 = bounds_min;
    }
    local_120 = pIVar12->y;
    local_d8.XRef = bounds_min->x;
    local_d8.Width = (bounds_max->x - local_d8.XRef) / (double)cols;
    local_148._8_8_ = local_148._0_8_;
    local_148._0_8_ = (double)rows;
    local_d8.Height = (bounds_max->y - bounds_min->y) / (double)rows;
    local_d8.Count = cols * rows;
    local_d8.HalfSize.x = local_d8.Width * 0.5;
    local_d8.HalfSize.y = local_d8.Height * 0.5;
    pIVar4 = GImPlot->CurrentPlot;
    fVar3 = (float)pIVar4->CurrentYAxis;
    local_d8.Values = values;
    local_d8.Rows = rows;
    local_d8.Cols = cols;
    local_d8.ScaleMin = scale_min;
    local_d8.ScaleMax = scale_max;
    local_d8.YRef = local_120;
    local_d8.YDir = dVar20;
    switch(GImPlot->Scales[(int)fVar3]) {
    case 0:
      local_78.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar3;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLinLin>>
                (&local_78,DrawList,&pIVar4->PlotRect);
      break;
    case 1:
      local_78.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar3;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLogLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLogLin> *)
                 &local_78,DrawList,&pIVar4->PlotRect);
      break;
    case 2:
      local_78.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar3;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLinLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLog> *)
                 &local_78,DrawList,&pIVar4->PlotRect);
      break;
    case 3:
      local_78.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar3;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLogLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLogLog> *)
                 &local_78,DrawList,&pIVar4->PlotRect);
    }
    if ((fmt != (char *)0x0) && (0 < rows)) {
      dVar1 = (bounds_max->x - bounds_min->x) / (double)cols;
      local_130 = (bounds_max->y - bounds_min->y) / (double)local_148._0_8_;
      lVar13 = (long)transformer.YAxis;
      local_138 = local_130 * 0.5;
      dVar19 = dVar1 * 0.5;
      local_110 = lVar13 << 4;
      local_118 = 0.0;
      local_14c = 0;
      local_150 = 0;
      local_158 = rows;
      local_154 = cols;
      local_128 = values;
      local_108 = lVar13;
      local_100 = dVar19;
      local_f8 = dVar1;
      local_f0 = DrawList;
      iVar15 = cols;
      do {
        if (0 < iVar15) {
          local_e0 = (local_130 * local_118 + local_138) * dVar20 + local_120;
          local_e8 = values + local_150;
          dVar18 = 0.0;
          lVar17 = 0;
          do {
            pIVar8 = GImPlot;
            dVar19 = log10((dVar18 * dVar1 + bounds_min->x + dVar19) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar4 = pIVar8->CurrentPlot;
            dVar1 = (pIVar4->XAxis).Range.Min;
            local_148._0_8_ =
                 (double)(float)(dVar19 / pIVar8->LogDenX) * ((pIVar4->XAxis).Range.Max - dVar1) +
                 dVar1;
            dVar19 = log10(local_e0 / pIVar4->YAxis[lVar13].Range.Min);
            puVar10 = local_e8;
            pIVar4 = pIVar8->CurrentPlot;
            dVar1 = pIVar4->YAxis[lVar13].Range.Min;
            local_148 = ZEXT416((uint)(float)(((double)local_148._0_8_ - (pIVar4->XAxis).Range.Min)
                                              * pIVar8->Mx +
                                             (double)*(float *)((long)&pIVar8->PixelRange[0].Min.x +
                                                               local_110)));
            dVar1 = (((double)(float)(dVar19 / pIVar8->LogDenY[local_108]) *
                      (pIVar4->YAxis[lVar13].Range.Max - dVar1) + dVar1) - dVar1) *
                    pIVar8->My[local_108] +
                    (double)*(float *)((long)&pIVar8->PixelRange[0].Min.y + local_110);
            uStack_44 = (undefined4)((ulong)dVar1 >> 0x20);
            local_48 = (float)dVar1;
            sprintf((char *)&local_78,local_160,(ulong)local_e8[lVar17]);
            IVar7 = ImGui::CalcTextSize((char *)&local_78,(char *)0x0,false,-1.0);
            local_58._8_4_ = extraout_XMM0_Dc;
            local_58._0_4_ = IVar7.x;
            local_58._4_4_ = IVar7.y;
            local_58._12_4_ = extraout_XMM0_Dd;
            dVar1 = ((double)puVar10[lVar17] - scale_min) / (scale_max - scale_min);
            dVar19 = 1.0;
            if (dVar1 <= 1.0) {
              dVar19 = dVar1;
            }
            IVar21 = SampleColormap((float)(double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar19),-1);
            local_168.x = (float)local_148._0_4_ - (float)local_58._0_4_ * 0.5;
            local_168.y = local_48 - (float)local_58._4_4_ * 0.5;
            ImDrawList::AddText(local_f0,&local_168,
                                -(uint)(IVar21.z * 0.114 + IVar21.x * 0.299 + IVar21.y * 0.587 <=
                                       0.5) | 0xff000000,(char *)&local_78,(char *)0x0);
            dVar18 = dVar18 + 1.0;
            lVar17 = lVar17 + 1;
            dVar19 = local_100;
            dVar1 = local_f8;
          } while (cols != (int)lVar17);
          local_150 = local_150 + (int)lVar17;
          values = local_128;
          rows = local_158;
          iVar15 = local_154;
        }
        local_118 = local_118 + 1.0;
        local_14c = local_14c + 1;
      } while (local_14c != rows);
    }
  }
  else {
    dVar5 = log10(bounds_min->x / (GImPlot->CurrentPlot->XAxis).Range.Min);
    dVar20 = pIVar8->LogDenX;
    pIVar4 = pIVar8->CurrentPlot;
    dVar1 = (pIVar4->XAxis).Range.Min;
    dVar19 = (pIVar4->XAxis).Range.Max;
    dVar6 = log10(bounds_min->y / pIVar4->YAxis[transformer.YAxis].Range.Min);
    pIVar9 = GImPlot;
    pIVar4 = pIVar8->CurrentPlot;
    dVar18 = pIVar4->YAxis[transformer.YAxis].Range.Min;
    local_d8.Values =
         (uchar *)CONCAT44((float)((((double)(float)(dVar6 / pIVar8->LogDenY[transformer.YAxis]) *
                                     (pIVar4->YAxis[transformer.YAxis].Range.Max - dVar18) + dVar18)
                                   - dVar18) * pIVar8->My[transformer.YAxis] +
                                  (double)pIVar8->PixelRange[transformer.YAxis].Min.y),
                           (float)((((double)(float)(dVar5 / dVar20) * (dVar19 - dVar1) + dVar1) -
                                   (pIVar4->XAxis).Range.Min) * pIVar8->Mx +
                                  (double)pIVar8->PixelRange[transformer.YAxis].Min.x));
    dVar5 = log10(bounds_max->x / (GImPlot->CurrentPlot->XAxis).Range.Min);
    dVar20 = pIVar9->LogDenX;
    pIVar4 = pIVar9->CurrentPlot;
    dVar1 = (pIVar4->XAxis).Range.Min;
    dVar19 = (pIVar4->XAxis).Range.Max;
    dVar6 = log10(bounds_max->y / pIVar4->YAxis[transformer.YAxis].Range.Min);
    pIVar4 = pIVar9->CurrentPlot;
    dVar18 = pIVar4->YAxis[transformer.YAxis].Range.Min;
    local_78.Getter =
         (GetterHeatmap<unsigned_char> *)
         CONCAT44((float)((((double)(float)(dVar6 / pIVar9->LogDenY[transformer.YAxis]) *
                            (pIVar4->YAxis[transformer.YAxis].Range.Max - dVar18) + dVar18) - dVar18
                          ) * pIVar9->My[transformer.YAxis] +
                         (double)pIVar9->PixelRange[transformer.YAxis].Min.y),
                  (float)((((double)(float)(dVar5 / dVar20) * (dVar19 - dVar1) + dVar1) -
                          (pIVar4->XAxis).Range.Min) * pIVar9->Mx +
                         (double)pIVar9->PixelRange[transformer.YAxis].Min.x));
    col = GetColormapColorU32(0,(pIVar8->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,(ImVec2 *)&local_d8,(ImVec2 *)&local_78,col,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}